

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.cc
# Opt level: O2

void __thiscall Encoder::~Encoder(Encoder *this)

{
  S2LogMessage local_10;
  
  if (this->limit_ < this->buf_) {
    S2LogMessage::S2LogMessage
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.cc"
               ,0x23,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_10.stream_,"Check failed: (buf_) <= (limit_) ");
    abort();
  }
  if (this->underlying_buffer_ != &kEmptyBuffer) {
    operator_delete(this->underlying_buffer_);
    return;
  }
  return;
}

Assistant:

Encoder::~Encoder() {
  S2_CHECK_LE(buf_, limit_);  // Catch the buffer overflow.
  if (underlying_buffer_ != &kEmptyBuffer) {
    std::allocator<unsigned char>().deallocate(
        underlying_buffer_, limit_ - orig_);
  }
}